

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastSmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *p;
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  char *pcVar6;
  ulong uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  size_t size_1;
  Arena *arena;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  ulong hasbits_00;
  uint *puVar9;
  size_t size;
  pair<const_char_*,_int> pVar10;
  string_view sVar11;
  string_view data_00;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this.data = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((this.data & 7) != 0) {
    AlignFail(this.data);
  }
  p = (byte *)(ptr + 1);
  aVar8.data = (ulong)data.field_0 >> 0x10 & 0xffff;
  arena = (Arena *)(msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  bVar1 = *ptr;
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  bVar2 = *p;
  pcVar6 = (char *)(ulong)bVar2;
  uVar4 = (uint)bVar2;
  if (arena == (Arena *)0x0) {
    if ((char)bVar2 < '\0') {
      pVar10 = ReadSizeFallback((char *)p,(uint)bVar2);
      ctx_00 = pVar10._8_8_;
      if (pVar10.first == (char *)0x0) goto LAB_0043cdf4;
      uVar4 = pVar10.second;
      pcVar6 = pVar10.first;
    }
    else {
      pcVar6 = ptr + 2;
    }
    iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar6);
    if ((int)uVar4 <= iVar3) {
      sVar11._M_str = pcVar6;
      sVar11._M_len = (long)(int)uVar4;
      MicroString::SetImpl((MicroString *)this,sVar11,(Arena *)0x0,7);
      puVar5 = (ushort *)(pcVar6 + (int)uVar4);
      goto LAB_0043ce2f;
    }
    arena = (Arena *)0x0;
  }
  else {
    if ((char)bVar2 < '\0') {
      pVar10 = ReadSizeFallback((char *)p,(uint)bVar2);
      ctx_00 = pVar10._8_8_;
      if (pVar10.first == (char *)0x0) goto LAB_0043cdf4;
      uVar4 = pVar10.second;
      pcVar6 = pVar10.first;
    }
    else {
      pcVar6 = ptr + 2;
    }
    iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar6);
    if ((int)uVar4 <= iVar3) {
      data_00._M_str = pcVar6;
      data_00._M_len = (long)(int)uVar4;
      MicroString::SetImpl((MicroString *)this,data_00,arena,7);
      puVar5 = (ushort *)(pcVar6 + (int)uVar4);
      goto LAB_0043ce2f;
    }
  }
  aVar8.data = this.data;
  puVar5 = (ushort *)
           EpsCopyInputStream::ReadMicroStringFallback
                     (&ctx->super_EpsCopyInputStream,pcVar6,uVar4,(MicroString *)this,arena);
  ctx_00 = extraout_RDX;
  if (puVar5 == (ushort *)0x0) {
LAB_0043cdf4:
    pcVar6 = Error(msg,pcVar6,ctx_00,(TcFieldData)aVar8,table,hasbits_00);
    return pcVar6;
  }
LAB_0043ce2f:
  sVar11 = MicroString::Get((MicroString *)this);
  iVar3 = utf8_range_IsValid(sVar11._M_str,sVar11._M_len);
  if (iVar3 == 0) {
    ReportFastUtf8Error((uint)bVar1,table);
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar9 & 3) != 0) {
        AlignFail(puVar9);
      }
      *puVar9 = *puVar9 | (uint)hasbits_00;
    }
    return (char *)puVar5;
  }
  uVar4 = (uint)table->fast_idx_mask & (uint)*puVar5;
  if ((uVar4 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar7 = (ulong)(uVar4 & 0xfffffff8);
  pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                             (msg,puVar5,ctx,
                              (ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),table
                              ,hasbits_00);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}